

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O0

int Res_SatAddAnd(sat_solver *pSat,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1)

{
  int iVar2;
  lit local_38;
  lit local_34;
  lit Lits [3];
  int fCompl1_local;
  int fCompl0_local;
  int iVar1_local;
  int iVar0_local;
  int iVar_local;
  sat_solver *pSat_local;
  
  Lits[1] = fCompl1;
  Lits[2] = fCompl0;
  local_38 = toLitCond(iVar,1);
  local_34 = toLitCond(iVar0,Lits[2]);
  iVar2 = sat_solver_addclause(pSat,&local_38,Lits);
  if (iVar2 == 0) {
    pSat_local._4_4_ = 0;
  }
  else {
    local_38 = toLitCond(iVar,1);
    local_34 = toLitCond(iVar1,Lits[1]);
    iVar2 = sat_solver_addclause(pSat,&local_38,Lits);
    if (iVar2 == 0) {
      pSat_local._4_4_ = 0;
    }
    else {
      local_38 = toLitCond(iVar,0);
      local_34 = toLitCond(iVar0,(uint)((Lits[2] != 0 ^ 0xffU) & 1));
      Lits[0] = toLitCond(iVar1,(uint)((Lits[1] != 0 ^ 0xffU) & 1));
      iVar2 = sat_solver_addclause(pSat,&local_38,Lits + 1);
      if (iVar2 == 0) {
        pSat_local._4_4_ = 0;
      }
      else {
        pSat_local._4_4_ = 1;
      }
    }
  }
  return pSat_local._4_4_;
}

Assistant:

int Res_SatAddAnd( sat_solver * pSat, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1 )
{
    lit Lits[3];

    Lits[0] = toLitCond( iVar, 1 );
    Lits[1] = toLitCond( iVar0, fCompl0 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar, 1 );
    Lits[1] = toLitCond( iVar1, fCompl1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 2 ) )
        return 0;

    Lits[0] = toLitCond( iVar, 0 );
    Lits[1] = toLitCond( iVar0, !fCompl0 );
    Lits[2] = toLitCond( iVar1, !fCompl1 );
    if ( !sat_solver_addclause( pSat, Lits, Lits + 3 ) )
        return 0;

    return 1;
}